

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O0

void __thiscall QtMWidgets::Stepper::mouseReleaseEvent(Stepper *this,QMouseEvent *event)

{
  MouseButton MVar1;
  StepperPrivate *pSVar2;
  socklen_t *in_RCX;
  sockaddr *__addr;
  int __fd;
  QMouseEvent *event_local;
  Stepper *this_local;
  
  __fd = (int)event;
  MVar1 = QSinglePointEvent::button((QSinglePointEvent *)event);
  if (MVar1 == LeftButton) {
    pSVar2 = QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>
             ::operator->(&this->d);
    pSVar2->button = NoButton;
    QScopedPointer<QtMWidgets::StepperPrivate,_QScopedPointerDeleter<QtMWidgets::StepperPrivate>_>::
    operator->(&this->d);
    QTimer::stop();
    QEvent::accept((QEvent *)event,__fd,__addr,in_RCX);
  }
  else {
    QEvent::ignore((QEvent *)event);
  }
  return;
}

Assistant:

void
Stepper::mouseReleaseEvent( QMouseEvent * event )
{
	if( event->button() == Qt::LeftButton )
	{
		d->button = StepperPrivate::NoButton;

		d->timer->stop();

		event->accept();
	}
	else
		event->ignore();
}